

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

char __thiscall smf::Options::getChar(Options *this,string *optionName)

{
  char cVar1;
  string local_28;
  
  getString(&local_28,this,optionName);
  cVar1 = *local_28._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return cVar1;
}

Assistant:

char Options::getChar(const std::string& optionName) {
	return getString(optionName).c_str()[0];
}